

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_storage.cpp
# Opt level: O2

vector<duckdb::SecretEntry,_true> * __thiscall
duckdb::CatalogSetSecretStorage::AllSecrets
          (vector<duckdb::SecretEntry,_true> *__return_storage_ptr__,CatalogSetSecretStorage *this,
          optional_ptr<duckdb::CatalogTransaction,_true> transaction)

{
  CatalogTransaction transaction_00;
  pointer this_00;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  CatalogTransaction local_48;
  
  (__return_storage_ptr__->super_vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>).
  super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._8_8_ = 0;
  (__return_storage_ptr__->super_vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>).
  super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>).
  super__Vector_base<duckdb::SecretEntry,_std::allocator<duckdb::SecretEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:80:55)>
             ::_M_invoke;
  local_58 = ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/main/secret/secret_storage.cpp:80:55)>
             ::_M_manager;
  local_68._M_unused._M_object = __return_storage_ptr__;
  this_00 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::
            operator->(&this->secrets);
  GetTransactionOrDefault(&local_48,this,transaction);
  transaction_00.context.ptr = local_48.context.ptr;
  transaction_00.db.ptr = local_48.db.ptr;
  transaction_00.transaction.ptr = local_48.transaction.ptr;
  transaction_00.transaction_id = local_48.transaction_id;
  transaction_00.start_time = local_48.start_time;
  CatalogSet::Scan(this_00,transaction_00,(function<void_(duckdb::CatalogEntry_&)> *)&local_68);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

vector<SecretEntry> CatalogSetSecretStorage::AllSecrets(optional_ptr<CatalogTransaction> transaction) {
	vector<SecretEntry> ret_value;
	const std::function<void(CatalogEntry &)> callback = [&](CatalogEntry &entry) {
		auto &cast_entry = entry.Cast<SecretCatalogEntry>();
		ret_value.push_back(*cast_entry.secret);
	};
	secrets->Scan(GetTransactionOrDefault(transaction), callback);
	return ret_value;
}